

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O0

void __thiscall de::cmdline::detail::Parser::Parser(Parser *this)

{
  Option<de::cmdline::(anonymous_namespace)::Help> local_48;
  Parser *local_10;
  Parser *this_local;
  
  local_10 = this;
  std::
  vector<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
  ::vector(&this->m_options);
  Option<de::cmdline::(anonymous_namespace)::Help>::Option
            (&local_48,"h","help","Show this help",(char *)0x0);
  addOption<de::cmdline::(anonymous_namespace)::Help>(this,&local_48);
  return;
}

Assistant:

Parser::Parser (void)
{
	addOption(Option<Help>("h", "help", "Show this help"));
}